

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::InitializePipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          GraphicsPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  IRenderPass *pIVar3;
  AttachmentReference *pAVar4;
  LayoutElement *pLVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  GraphicsPipelineData *pGVar11;
  RenderDeviceVkImpl *pRVar12;
  undefined4 extraout_var;
  RenderPassVkImpl *this_00;
  SubpassDesc *pSVar13;
  LayoutElement *pLayoutElements;
  Char *pCVar14;
  uint *puVar15;
  size_t sVar16;
  uint uVar17;
  char *in_RCX;
  Uint32 rt;
  char *pcVar18;
  long lVar19;
  AttachmentReference *DSAttachmentRef;
  ulong uVar20;
  string msg;
  string local_58;
  PipelineStateBase<Diligent::EngineVkImplTraits> *local_38;
  
  pGVar11 = FixedLinearAllocator::
            Construct<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
                      (MemPool);
  (this->field_6).m_pGraphicsPipelineData = pGVar11;
  MemPool->m_pAllocator = (IMemoryAllocator *)0x0;
  pGVar11 = (this->field_6).m_pGraphicsPipelineData;
  if ((GraphicsPipelineData *)MemPool->m_pDataStart != pGVar11) {
    FormatString<char[26],char[29]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Ptr == m_pPipelineDataRawMem",(char (*) [29])in_RCX);
    in_RCX = (char *)0x3b7;
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"InitializePipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x3b7);
    std::__cxx11::string::~string((string *)&local_58);
    pGVar11 = (this->field_6).m_pGraphicsPipelineData;
  }
  memcpy(pGVar11,&CreateInfo->GraphicsPipeline,0xbc);
  pRVar12 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                       );
  CorrectGraphicsPipelineDesc
            (&pGVar11->Desc,
             &(pRVar12->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features);
  CopyResourceLayout(&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,
                     &(this->
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      ).m_Desc.ResourceLayout,MemPool);
  local_38 = this;
  CopyResourceSignatures(this,&CreateInfo->super_PipelineStateCreateInfo,MemPool);
  RefCntAutoPtr<Diligent::IRenderPass>::operator=(&pGVar11->pRenderPass,(pGVar11->Desc).pRenderPass)
  ;
  pIVar3 = (pGVar11->pRenderPass).m_pObject;
  if (pIVar3 != (IRenderPass *)0x0) {
    iVar9 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    lVar19 = CONCAT44(extraout_var,iVar9);
    if (*(uint *)(lVar19 + 0x18) <= (uint)(pGVar11->Desc).SubpassIndex) {
      FormatString<char[26],char[52]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GraphicsPipeline.SubpassIndex < RPDesc.SubpassCount",
                 (char (*) [52])in_RCX);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"InitializePipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x3c8);
      std::__cxx11::string::~string((string *)&local_58);
    }
    this_00 = RefCntAutoPtr<Diligent::IRenderPass>::RawPtr<Diligent::RenderPassVkImpl>
                        (&pGVar11->pRenderPass);
    pSVar13 = RenderPassBase<Diligent::EngineVkImplTraits>::GetSubpass
                        (&this_00->super_RenderPassBase<Diligent::EngineVkImplTraits>,
                         (uint)(pGVar11->Desc).SubpassIndex);
    uVar10 = pSVar13->RenderTargetAttachmentCount;
    (pGVar11->Desc).NumRenderTargets = (Uint8)uVar10;
    for (pcVar18 = (char *)0x0; in_RCX = (char *)(ulong)uVar10, pcVar18 < in_RCX;
        pcVar18 = pcVar18 + 1) {
      pAVar4 = pSVar13->pRenderTargetAttachments;
      uVar17 = pAVar4[(long)pcVar18].AttachmentIndex;
      if (uVar17 != 0xffffffff) {
        if (*(uint *)(lVar19 + 8) <= uVar17) {
          FormatString<char[26],char[57]>
                    (&local_58,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                     (char (*) [57])(ulong)uVar17);
          DebugAssertionFailed
                    (local_58._M_dataplus._M_p,"InitializePipelineDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x3d1);
          std::__cxx11::string::~string((string *)&local_58);
          uVar17 = pAVar4[(long)pcVar18].AttachmentIndex;
          uVar10 = pSVar13->RenderTargetAttachmentCount;
        }
        (pGVar11->Desc).RTVFormats[(long)pcVar18] =
             *(TEXTURE_FORMAT *)(*(long *)(lVar19 + 0x10) + (ulong)uVar17 * 0x10);
      }
    }
    pAVar4 = pSVar13->pDepthStencilAttachment;
    if ((pAVar4 != (AttachmentReference *)0x0) &&
       (uVar10 = pAVar4->AttachmentIndex, uVar10 != 0xffffffff)) {
      if (*(uint *)(lVar19 + 8) <= uVar10) {
        FormatString<char[26],char[57]>
                  (&local_58,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                   (char (*) [57])in_RCX);
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"InitializePipelineDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x3db);
        std::__cxx11::string::~string((string *)&local_58);
        uVar10 = pAVar4->AttachmentIndex;
      }
      in_RCX = *(char **)(lVar19 + 0x10);
      (pGVar11->Desc).DSVFormat = *(TEXTURE_FORMAT *)(in_RCX + (ulong)uVar10 * 0x10);
    }
  }
  uVar20 = (ulong)(pGVar11->Desc).InputLayout.NumElements;
  if (uVar20 == 0) {
    pLayoutElements = (LayoutElement *)0x0;
  }
  else {
    pLayoutElements = FixedLinearAllocator::ConstructArray<Diligent::LayoutElement>(MemPool,uVar20);
    lVar19 = 0;
    for (uVar20 = 0; uVar10 = (pGVar11->Desc).InputLayout.NumElements, uVar20 < uVar10;
        uVar20 = uVar20 + 1) {
      pLVar5 = (pGVar11->Desc).InputLayout.LayoutElements;
      *(undefined8 *)(&pLayoutElements->Frequency + lVar19) =
           *(undefined8 *)(&pLVar5->Frequency + lVar19);
      puVar1 = (undefined8 *)((long)&pLVar5->HLSLSemantic + lVar19);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)&pLVar5->NumComponents + lVar19);
      uVar8 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pLayoutElements->NumComponents + lVar19);
      *puVar2 = *puVar1;
      puVar2[1] = uVar8;
      puVar1 = (undefined8 *)((long)&pLayoutElements->HLSLSemantic + lVar19);
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      pcVar18 = *(char **)((long)&pLVar5->HLSLSemantic + lVar19);
      if (pcVar18 == (char *)0x0) {
        FormatString<char[26],char[32]>
                  (&local_58,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SrcElem.HLSLSemantic != nullptr",(char (*) [32])in_RCX);
        in_RCX = (char *)0x3ea;
        DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"InitializePipelineDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x3ea);
        std::__cxx11::string::~string((string *)&local_58);
        pcVar18 = *(char **)((long)&pLVar5->HLSLSemantic + lVar19);
      }
      pCVar14 = FixedLinearAllocator::CopyString(MemPool,pcVar18,0);
      *(Char **)((long)&pLayoutElements->HLSLSemantic + lVar19) = pCVar14;
      lVar19 = lVar19 + 0x28;
    }
    ResolveInputLayoutAutoOffsetsAndStrides
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,pLayoutElements,
               uVar10);
    uVar20 = local_58._M_string_length - (long)local_58._M_dataplus._M_p >> 2;
    pGVar11->BufferSlotsUsed = (Uint8)uVar20;
    puVar15 = FixedLinearAllocator::CopyConstructArray<unsigned_int,unsigned_int>
                        (MemPool,(uint *)local_58._M_dataplus._M_p,uVar20 & 0xff);
    pGVar11->pStrides = puVar15;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  }
  (pGVar11->Desc).InputLayout.LayoutElements = pLayoutElements;
  sVar16 = ComputeRenderTargetFormatsHash
                     ((uint)(pGVar11->Desc).NumRenderTargets,(pGVar11->Desc).RTVFormats,
                      (pGVar11->Desc).DSVFormat);
  ((local_38->field_6).m_pGraphicsPipelineData)->dvpRenderTargetFormatsHash = sVar16;
  return;
}

Assistant:

void InitializePipelineDesc(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                FixedLinearAllocator&                  MemPool)
    {
        this->m_pGraphicsPipelineData = MemPool.Construct<GraphicsPipelineData>();
        void* Ptr                     = MemPool.ReleaseOwnership();
        VERIFY_EXPR(Ptr == m_pPipelineDataRawMem);

        GraphicsPipelineDesc&       GraphicsPipeline = this->m_pGraphicsPipelineData->Desc;
        RefCntAutoPtr<IRenderPass>& pRenderPass      = this->m_pGraphicsPipelineData->pRenderPass;
        Uint8&                      BufferSlotsUsed  = this->m_pGraphicsPipelineData->BufferSlotsUsed;
        Uint32*&                    pStrides         = this->m_pGraphicsPipelineData->pStrides;

        GraphicsPipeline = CreateInfo.GraphicsPipeline;
        CorrectGraphicsPipelineDesc(GraphicsPipeline, this->GetDevice()->GetDeviceInfo().Features);

        CopyResourceLayout(CreateInfo.PSODesc.ResourceLayout, this->m_Desc.ResourceLayout, MemPool);
        CopyResourceSignatures(CreateInfo, MemPool);

        pRenderPass = GraphicsPipeline.pRenderPass;
        if (pRenderPass)
        {
            const RenderPassDesc& RPDesc = pRenderPass->GetDesc();
            VERIFY_EXPR(GraphicsPipeline.SubpassIndex < RPDesc.SubpassCount);
            const SubpassDesc& Subpass = pRenderPass.template RawPtr<RenderPassImplType>()->GetSubpass(GraphicsPipeline.SubpassIndex);

            GraphicsPipeline.NumRenderTargets = static_cast<Uint8>(Subpass.RenderTargetAttachmentCount);
            for (Uint32 rt = 0; rt < Subpass.RenderTargetAttachmentCount; ++rt)
            {
                const AttachmentReference& RTAttachmentRef = Subpass.pRenderTargetAttachments[rt];
                if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    VERIFY_EXPR(RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
                    GraphicsPipeline.RTVFormats[rt] = RPDesc.pAttachments[RTAttachmentRef.AttachmentIndex].Format;
                }
            }

            if (Subpass.pDepthStencilAttachment != nullptr)
            {
                const AttachmentReference& DSAttachmentRef = *Subpass.pDepthStencilAttachment;
                if (DSAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    VERIFY_EXPR(DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
                    GraphicsPipeline.DSVFormat = RPDesc.pAttachments[DSAttachmentRef.AttachmentIndex].Format;
                }
            }
        }

        const InputLayoutDesc& InputLayout     = GraphicsPipeline.InputLayout;
        LayoutElement*         pLayoutElements = nullptr;
        if (InputLayout.NumElements > 0)
        {
            pLayoutElements = MemPool.ConstructArray<LayoutElement>(InputLayout.NumElements);
            for (size_t Elem = 0; Elem < InputLayout.NumElements; ++Elem)
            {
                const LayoutElement& SrcElem = InputLayout.LayoutElements[Elem];
                pLayoutElements[Elem]        = SrcElem;
                VERIFY_EXPR(SrcElem.HLSLSemantic != nullptr);
                pLayoutElements[Elem].HLSLSemantic = MemPool.CopyString(SrcElem.HLSLSemantic);
            }

            // Correct description and compute offsets and tight strides
            const std::vector<Uint32> Strides = ResolveInputLayoutAutoOffsetsAndStrides(pLayoutElements, InputLayout.NumElements);
            BufferSlotsUsed                   = static_cast<Uint8>(Strides.size());

            pStrides = MemPool.CopyConstructArray<Uint32>(Strides.data(), BufferSlotsUsed);
        }
        GraphicsPipeline.InputLayout.LayoutElements = pLayoutElements;

#ifdef DILIGENT_DEVELOPMENT
        this->m_pGraphicsPipelineData->dvpRenderTargetFormatsHash = ComputeRenderTargetFormatsHash(
            GraphicsPipeline.NumRenderTargets, GraphicsPipeline.RTVFormats, GraphicsPipeline.DSVFormat);
#endif
    }